

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall sparse_parameters::shallow_copy(sparse_parameters *this,sparse_parameters *input)

{
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  float *pfVar4;
  long in_RSI;
  sparse_parameters *in_RDI;
  iterator iter;
  size_t in_stack_00000198;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_stack_ffffffffffffffc8;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_stack_ffffffffffffffd0;
  void *__src;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_18;
  long local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_seeded & 1U) == 0) {
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      local_20._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
           ::end(in_stack_ffffffffffffffc8);
      bVar1 = std::__detail::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *
                            )0x198fdb);
      free(ppVar3->second);
      std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *)
                 in_stack_ffffffffffffffd0);
    }
  }
  std::
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  ::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI->_weight_mask = *(uint64_t *)(local_10 + 0x38);
  in_RDI->_stride_shift = *(uint32_t *)(local_10 + 0x40);
  free(in_RDI->default_value);
  stride(in_RDI);
  pfVar4 = calloc_or_throw<float>(in_stack_00000198);
  in_RDI->default_value = pfVar4;
  pfVar4 = in_RDI->default_value;
  __src = *(void **)(local_10 + 0x50);
  uVar2 = stride(in_RDI);
  memcpy(pfVar4,__src,(ulong)uVar2);
  in_RDI->default_data = *(void **)(local_10 + 0x48);
  in_RDI->_seeded = true;
  return;
}

Assistant:

void shallow_copy(const sparse_parameters& input)
  {
    // TODO: this is level-1 copy (weight* are stilled shared)
    if (!_seeded)
    {
      for (auto iter = _map.begin(); iter != _map.end(); ++iter) free(iter->second);
    }
    _map = input._map;
    _weight_mask = input._weight_mask;
    _stride_shift = input._stride_shift;
    free(default_value);
    default_value = calloc_mergable_or_throw<weight>(stride());
    memcpy(default_value, input.default_value, stride());
    default_data = input.default_data;
    _seeded = true;
  }